

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O0

bool __thiscall mcsFile::ReadNextSector(mcsFile *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  bool local_39;
  undefined1 local_2e [8];
  RecInfo rec;
  mcsFile *this_local;
  
  rec._14_8_ = this;
  bVar1 = ProcessNextLine(this,(RecInfo *)local_2e);
  if (bVar1) {
    if (local_2e[4] == '\x04') {
      if (local_2e[0] == 2) {
        this->startAddr = (long)(int)((uint)local_2e[6] * 0x10000);
        this->numBytes = 0;
        while( true ) {
          local_39 = false;
          if (this->numBytes < 0x10000) {
            local_39 = ProcessNextLine(this,(RecInfo *)local_2e);
          }
          if (local_39 == false) break;
          if (local_2e[4] == '\0') {
            if (this->numBytes != (ulong)(ushort)local_2e._2_2_) {
              poVar2 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->line_num);
              poVar2 = std::operator<<(poVar2,", expected offset ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->numBytes);
              poVar2 = std::operator<<(poVar2,", got offset ");
              pvVar3 = (void *)std::ostream::operator<<(poVar2,local_2e._2_2_);
              std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
              return false;
            }
            memcpy(this->curSector + this->numBytes,local_2e + 5,(ulong)local_2e[0]);
            this->numBytes = (ulong)local_2e[0] + this->numBytes;
          }
          else {
            if (local_2e[4] == '\x01') break;
            poVar2 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->line_num);
            poVar2 = std::operator<<(poVar2," ignoring record type ");
            poVar2 = std::operator<<(poVar2,local_2e[4]);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          }
        }
        if (this->numBytes < 0x10000) {
          memset(this->curSector + this->numBytes,0xff,0x10000 - this->numBytes);
        }
        else if (0x10000 < this->numBytes) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: too many bytes = ");
          pvVar3 = (void *)std::ostream::operator<<(poVar2,this->numBytes);
          std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        }
        this_local._7_1_ = true;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->line_num);
        poVar2 = std::operator<<(poVar2," has invalid data length = ");
        poVar2 = std::operator<<(poVar2,local_2e[0]);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->line_num);
      poVar2 = std::operator<<(poVar2," does not start a sector");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mcsFile::ReadNextSector()
{
    RecInfo rec;
    if (!ProcessNextLine(rec)) return false;
    if (rec.type != RECORD_EXT_LINEAR) {
        std::cerr << "ReadNextSector: line " << line_num << " does not start a sector" << std::endl;
        return false;
    }
    if (rec.ndata != 2) {
        std::cerr << "ReadNextSector: line " << line_num << " has invalid data length = "
                  << rec.ndata << std::endl;
        return false;
    }
    startAddr = ((rec.data[0]<<16)+rec.data[1]) << 16;
    numBytes = 0L;
    while ((numBytes < sizeof(curSector)) && ProcessNextLine(rec)) {
        if (rec.type == RECORD_DATA) {
            if (numBytes != rec.addr) {
                std::cerr << "ReadNextSector: line " << line_num
                          << ", expected offset " << numBytes << ", got offset "
                          << rec.addr << std::endl;
                return false;
            }
            memcpy(curSector+numBytes, rec.data, rec.ndata);
            numBytes += rec.ndata;
        }
        else if (rec.type == RECORD_EOF)
            break;
        else
            std::cerr << "ReadNextSector: line " << line_num 
                      << " ignoring record type " << rec.type << std::endl;
    }
    // Pad sector with 0xff, just in case
    if (numBytes < sizeof(curSector)) {
        memset(curSector+numBytes, 0xff, sizeof(curSector)-numBytes);
    }
    else if (numBytes > sizeof(curSector))
        std::cerr << "ReadNextSector: too many bytes = " << numBytes << std::endl;
    return true;
}